

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview_p.h
# Opt level: O3

void __thiscall
QTreeViewPrivate::AnimatedOperation::updateCurrentValue(AnimatedOperation *this,QVariant *param_1)

{
  int iVar1;
  int iVar2;
  QWidget *this_00;
  QWidgetData *pQVar3;
  uint uVar4;
  undefined8 uVar5;
  long in_FS_OFFSET;
  QRect local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = this->viewport;
  pQVar3 = this_00->data;
  iVar1 = (pQVar3->crect).y2.m_i;
  uVar5._0_4_ = (pQVar3->crect).x2.m_i - (pQVar3->crect).x1.m_i;
  iVar2 = (pQVar3->crect).y1.m_i;
  uVar4 = top(this);
  local_30._0_8_ = (ulong)uVar4 << 0x20;
  uVar5._4_4_ = (iVar1 - iVar2) + uVar4;
  local_30._8_8_ = uVar5;
  QWidget::update(this_00,&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void updateCurrentValue(const QVariant &) override { viewport->update(rect()); }